

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdGetSupportedFunction_Test::TestBody
          (cfdcapi_common_CfdGetSupportedFunction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int ret;
  uint64_t functions;
  unsigned_long *in_stack_ffffffffffffff10;
  CfdErrorCode *in_stack_ffffffffffffff18;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  uint64_t *in_stack_ffffffffffffff28;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_94;
  AssertionResult local_90;
  AssertHelper local_80;
  Message local_78;
  ulong local_70;
  undefined4 local_64;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = CfdGetSupportedFunction(in_stack_ffffffffffffff28);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3275be);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x32761b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x327670);
  local_64 = 1;
  local_70 = (ulong)((uint)local_10 & 1);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    in_stack_ffffffffffffff28 =
         (uint64_t *)testing::AssertionResult::failure_message((AssertionResult *)0x327724);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x19,(char *)in_stack_ffffffffffffff28);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message((Message *)0x327778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3277ca);
  local_14 = CfdGetSupportedFunction(in_stack_ffffffffffffff28);
  local_94 = 1;
  this_00 = &local_90;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (CfdErrorCode *)this_00,(int *)in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32786c);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x3278ba);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x327906);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdGetSupportedFunction) {
  uint64_t functions = 0;
  int ret = CfdGetSupportedFunction(&functions);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(1,  functions & 0x01);

  ret = CfdGetSupportedFunction(NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);
}